

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_mqtt_common.c
# Opt level: O2

int IoTHubTransport_MQTT_GetSupportedPlatformInfo
              (TRANSPORT_LL_HANDLE handle,PLATFORM_INFO_OPTION *info)

{
  LOGGER_LOG p_Var1;
  int iVar2;
  
  if (handle == (TRANSPORT_LL_HANDLE)0x0 || info == (PLATFORM_INFO_OPTION *)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar2 = 0x101e;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                ,"IoTHubTransport_MQTT_GetSupportedPlatformInfo",0x101d,1,
                "Invalid parameter specified (handle: %p, info: %p)",handle,info);
    }
  }
  else {
    *info = PLATFORM_INFO_OPTION_RETRIEVE_SQM;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int IoTHubTransport_MQTT_GetSupportedPlatformInfo(TRANSPORT_LL_HANDLE handle, PLATFORM_INFO_OPTION* info)
{
    int result;

    if (handle == NULL || info == NULL)
    {
        LogError("Invalid parameter specified (handle: %p, info: %p)", handle, info);
        result = MU_FAILURE;
    }
    else
    {
        *info = PLATFORM_INFO_OPTION_RETRIEVE_SQM;
        result = 0;
    }

    return result;
}